

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getLoopChangeLocations
          (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,RelationsAnalyzer *this,VRLocation *join,
          VectorSet<const_llvm::Value_*> *froms)

{
  pointer ppVVar1;
  V address;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *pvVar2;
  bool bVar3;
  VRLocation *pVVar4;
  pointer ppVVar5;
  mapped_type *pmVar6;
  HandlePtr pBVar7;
  pointer ppVVar8;
  pointer ppVVar9;
  pointer ppIVar10;
  iterator iVar11;
  pointer local_78;
  iterator iStack_70;
  pointer local_68;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *local_58;
  VRLocation *local_50;
  pointer local_48;
  VectorSet<const_llvm::Value_*> *local_40;
  ValueRelations *local_38;
  
  local_40 = froms;
  pVVar4 = VRLocation::getTreePredecessor(join);
  ppVVar5 = (pointer)operator_new(8);
  ppVVar9 = ppVVar5 + 1;
  *ppVVar5 = pVVar4;
  local_78 = ppVVar5;
  iStack_70._M_current = ppVVar9;
  local_68 = ppVVar9;
  local_50 = join;
  pmVar6 = std::
           map<const_dg::vr::VRLocation_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>,_std::less<const_dg::vr::VRLocation_*>,_std::allocator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>_>
           ::at((map<const_dg::vr::VRLocation_*,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>,_std::less<const_dg::vr::VRLocation_*>,_std::allocator<std::pair<const_dg::vr::VRLocation_*const,_std::vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>_>_>_>
                 *)(*(long *)(this + 0x40) + 0x10),&local_50);
  ppIVar10 = (pmVar6->
             super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_48 = (pmVar6->
             super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  iVar11._M_current = ppVVar9;
  local_58 = __return_storage_ptr__;
  if (ppIVar10 != local_48) {
    do {
      pVVar4 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),*ppIVar10);
      ppVVar8 = (local_40->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppVVar1 = (local_40->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppVVar8 != ppVVar1) {
        pVVar4 = *(VRLocation **)
                  ((long)(((pVVar4->successors).
                           super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>
                         ._M_t + 8);
        local_38 = &pVVar4->relations;
        do {
          address = *ppVVar8;
          bVar3 = mayOverwrite(this,*ppIVar10,address);
          if (bVar3) {
            pBVar7 = ValueRelations::maybeGet(local_38,address);
            pvVar2 = local_58;
            if ((pBVar7 == (HandlePtr)0x0) ||
               ((pBVar7->relatedBuckets)._M_elems[10].vec.
                super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (pBVar7->relatedBuckets)._M_elems[10].vec.
                super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
              (local_58->
              super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_58->
              super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (local_58->
              super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (local_78 == (pointer)0x0) {
                return local_58;
              }
              operator_delete(local_78,(long)local_68 - (long)local_78);
              return pvVar2;
            }
            local_50 = pVVar4;
            if (iStack_70._M_current == local_68) {
              std::vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>::
              _M_realloc_insert<dg::vr::VRLocation*>
                        ((vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>
                          *)&local_78,iStack_70,&local_50);
            }
            else {
              *iStack_70._M_current = pVVar4;
              iStack_70._M_current = iStack_70._M_current + 1;
            }
          }
          ppVVar8 = ppVVar8 + 1;
        } while (ppVVar8 != ppVVar1);
      }
      ppIVar10 = ppIVar10 + 1;
      ppVVar9 = local_68;
      __return_storage_ptr__ = local_58;
      ppVVar5 = local_78;
      iVar11._M_current = iStack_70._M_current;
    } while (ppIVar10 != local_48);
  }
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
  _M_impl.super__Vector_impl_data._M_start = ppVVar5;
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = iVar11._M_current;
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppVVar9;
  return __return_storage_ptr__;
}

Assistant:

std::vector<const VRLocation *>
RelationsAnalyzer::getLoopChangeLocations(const VRLocation &join,
                                          const VectorSet<V> &froms) const {
    std::vector<const VRLocation *> changeLocations = {
            &join.getTreePredecessor()};

    for (const auto &inloopInst : structure.getInloopValues(join)) {
        VRLocation &targetLoc =
                *codeGraph.getVRLocation(inloopInst).getSuccLocation(0);

        for (V from : froms) {
            if (mayOverwrite(inloopInst, from)) {
                if (!targetLoc.relations.hasLoad(from))
                    return {}; // no merge by load can happen here

                changeLocations.emplace_back(&targetLoc);
            }
        }
    }
    return changeLocations;
}